

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall
ncnn::NetPrivate::forward_layer
          (NetPrivate *this,int layer_index,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats
          ,Option *opt)

{
  int iVar1;
  const_reference ppLVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  int in_ESI;
  long in_RDI;
  int ret;
  int ret_1;
  int bottom_blob_index;
  size_t i;
  Layer *layer;
  Option *in_stack_000002b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_000002c0;
  Layer *in_stack_000002c8;
  NetPrivate *in_stack_000002d0;
  int in_stack_ffffffffffffff7c;
  Option *in_stack_ffffffffffffff80;
  int local_44;
  ulong local_38;
  value_type opt_00;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  ppLVar2 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x20),
                       (long)in_ESI);
  opt_00 = *ppLVar2;
  local_38 = 0;
  do {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&opt_00->bottoms);
    if (sVar3 <= local_38) {
      if (opt_00->featmask == 0) {
        local_44 = do_forward_layer(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
                                    in_stack_000002b8);
      }
      else {
        get_masked_option(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        local_44 = do_forward_layer(in_stack_000002d0,in_stack_000002c8,in_stack_000002c0,
                                    in_stack_000002b8);
      }
      if (local_44 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = local_44;
      }
      return local_4;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&opt_00->bottoms,local_38);
    iVar1 = *pvVar4;
    pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RDX,(long)iVar1);
    if (pvVar5->dims == 0) {
      std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 8),(long)iVar1);
      iVar1 = forward_layer((NetPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                            (int)((ulong)in_RDX >> 0x20),in_RCX,(Option *)opt_00);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int NetPrivate::forward_layer(int layer_index, std::vector<Mat>& blob_mats, const Option& opt) const
{
    const Layer* layer = layers[layer_index];

    //     NCNN_LOGE("forward_layer %d %s", layer_index, layer->name.c_str());

    // load bottom blobs
    for (size_t i = 0; i < layer->bottoms.size(); i++)
    {
        int bottom_blob_index = layer->bottoms[i];

        if (blob_mats[bottom_blob_index].dims == 0)
        {
            int ret = forward_layer(blobs[bottom_blob_index].producer, blob_mats, opt);
            if (ret != 0)
                return ret;
        }
    }

#if NCNN_BENCHMARK
    double start = get_current_time();
    Mat bottom_blob;
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        bottom_blob.dims = blob_mats[bottom_blob_index].dims;
        bottom_blob.w = blob_mats[bottom_blob_index].w;
        bottom_blob.h = blob_mats[bottom_blob_index].h;
        bottom_blob.c = blob_mats[bottom_blob_index].c;
        bottom_blob.elempack = blob_mats[bottom_blob_index].elempack;
        bottom_blob.elemsize = blob_mats[bottom_blob_index].elemsize;
    }
#endif
    int ret = 0;
    if (layer->featmask)
    {
        ret = do_forward_layer(layer, blob_mats, get_masked_option(opt, layer->featmask));
    }
    else
    {
        ret = do_forward_layer(layer, blob_mats, opt);
    }
#if NCNN_BENCHMARK
    double end = get_current_time();
    if (layer->one_blob_only)
    {
        int top_blob_index = layer->tops[0];
        benchmark(layer, bottom_blob, blob_mats[top_blob_index], start, end);
    }
    else
    {
        benchmark(layer, start, end);
    }
#endif
    if (ret != 0)
        return ret;

    //     NCNN_LOGE("forward_layer %d %s done", layer_index, layer->name.c_str());
    //     const Mat& blob = blob_mats[layer->tops[0]];
    //     NCNN_LOGE("[%-2d %-16s %-16s]  %d    blobs count = %-3d   size = %-3d x %-3d", layer_index, layer->type.c_str(), layer->name.c_str(), layer->tops[0], blob.c, blob.h, blob.w);

    return 0;
}